

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O3

void __thiscall gdsForge::gdsSRef(gdsForge *this,gdsSREF *in_SREF,bool minimal)

{
  _WordT _Var1;
  double dVar2;
  pointer pcVar3;
  undefined7 in_register_00000011;
  _WordT _Var4;
  _Base_bitset<1UL> inBits;
  int data [1];
  double arrDou [1];
  uint local_84;
  double local_80;
  undefined4 local_74;
  string local_70;
  string local_50;
  undefined8 local_30;
  
  local_80 = (double)CONCAT44(local_80._4_4_,0xa0400);
  fwrite(&local_80,1,4,(FILE *)this->gdsFile);
  if ((int)CONCAT71(in_register_00000011,minimal) == 0) {
    local_84 = in_SREF->plex;
    GDSwriteInt(this,0x2f03,(int *)&local_84,1);
  }
  pcVar3 = (in_SREF->name)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + (in_SREF->name)._M_string_length);
  GDSwriteStr(this,0x1206,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  _Var4 = (ulong)in_SREF->reflection * 0x8000;
  _Var1 = _Var4 + 4;
  if (in_SREF->scale != 1.0) {
    _Var4 = _Var1;
  }
  if (NAN(in_SREF->scale)) {
    _Var4 = _Var1;
  }
  inBits._M_w = _Var4;
  if (in_SREF->angle != 0.0) {
    inBits._M_w = _Var4 + 2;
  }
  if (NAN(in_SREF->angle)) {
    inBits._M_w = _Var4 + 2;
  }
  GDSwriteBitArr(this,0x1a01,(bitset<16UL>)inBits._M_w);
  dVar2 = in_SREF->scale;
  if ((dVar2 != 1.0) || (NAN(dVar2))) {
    local_80 = dVar2;
    GDSwriteRea(this,0x1b05,&local_80,1);
  }
  dVar2 = in_SREF->angle;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    local_80 = dVar2;
    GDSwriteRea(this,0x1c05,&local_80,1);
  }
  local_30._0_4_ = in_SREF->xCor;
  local_30._4_4_ = in_SREF->yCor;
  GDSwriteInt(this,0x1003,(int *)&local_30,2);
  if (!minimal) {
    local_84 = in_SREF->propattr;
    GDSwriteInt(this,0x2b02,(int *)&local_84,1);
    pcVar3 = (in_SREF->propvalue)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar3,pcVar3 + (in_SREF->propvalue)._M_string_length);
    GDSwriteStr(this,0x2c06,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  local_74 = 0x110400;
  fwrite(&local_74,1,4,(FILE *)this->gdsFile);
  return;
}

Assistant:

void gdsForge::gdsSRef(const gdsSREF &in_SREF, bool minimal)
{
  int data[1];
  this->GDSwriteRec(GDS_SREF);

  // ELFLAGS and PLEX are optional
  if (minimal == false) {
    data[0] = in_SREF.plex;
    this->GDSwriteInt(GDS_PLEX, data, 1);
  }

  // name of the structure that is referenced
  this->GDSwriteStr(GDS_SNAME, in_SREF.name);

  // two byte, bit array controlling reflection, magnification and rotation.
  bitset<16> bits;

  // reflect across x-axis
  bits.set(15, in_SREF.reflection);

  // magnification, default 1
  if (in_SREF.scale == 1)
    bits.set(2, 0);
  else
    bits.set(2, 1);

  // angle of rotation
  if (in_SREF.angle == 0)
    bits.set(1, 0);
  else
    bits.set(1, 1);

  this->GDSwriteBitArr(GDS_STRANS, bits);

  double arrDou[1];
  // Magnification, default 1
  if (in_SREF.scale != 1) {
    arrDou[0] = in_SREF.scale;
    this->GDSwriteRea(GDS_MAG, arrDou, 1);
  }

  // Angle measured counterclockwise
  if (in_SREF.angle != 0) {
    arrDou[0] = in_SREF.angle;
    this->GDSwriteRea(GDS_ANGLE, arrDou, 1);
  }

  int corXY[2];
  corXY[0] = in_SREF.xCor;
  corXY[1] = in_SREF.yCor;
  this->GDSwriteInt(GDS_XY, corXY, 2);

  // Optional goodies
  if (minimal == false) {
    data[0] = in_SREF.propattr;
    this->GDSwriteInt(GDS_PROPATTR, data, 1);

    this->GDSwriteStr(GDS_PROPVALUE, in_SREF.propvalue);
  }

  this->GDSwriteRec(GDS_ENDEL);
}